

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestCoherency::TextureViewTestCoherency
          (TextureViewTestCoherency *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"coherency","Verifies view/parent texture coherency");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dda660;
  this->m_are_images_supported = false;
  this->m_bo_id = 0;
  this->m_draw_fbo_id = 0;
  this->m_gradient_verification_po_id = 0;
  this->m_gradient_verification_po_sample_exact_uv_location = -1;
  this->m_gradient_verification_po_lod_location = -1;
  this->m_gradient_verification_po_texture_location = -1;
  this->m_gradient_verification_vs_id = 0;
  this->m_gradient_image_write_image_size_location = -1;
  this->m_gradient_image_write_po_id = 0;
  this->m_gradient_image_write_vs_id = 0;
  this->m_gradient_write_po_id = 0;
  this->m_gradient_write_fs_id = 0;
  this->m_gradient_write_vs_id = 0;
  this->m_read_fbo_id = 0;
  this->m_static_to_id = 0;
  this->m_to_id = 0;
  this->m_vao_id = 0;
  this->m_view_to_id = 0;
  this->m_verification_po_expected_color_location = -1;
  this->m_verification_po_lod_location = -1;
  this->m_verification_po_id = 0;
  this->m_verification_vs_id = 0;
  *(undefined1 **)&this->m_static_texture_height = &DAT_100000001;
  this->m_texture_height = 0x40;
  this->m_texture_n_components = 4;
  this->m_texture_n_levels = 7;
  this->m_texture_width = 0x40;
  this->m_static_color_byte[0] = 'd';
  this->m_static_color_byte[1] = '\0';
  this->m_static_color_byte[2] = 0xff;
  this->m_static_color_byte[3] = 200;
  this->m_static_color_float[0] = 0.39215687;
  this->m_static_color_float[1] = 0.0;
  this->m_static_color_float[2] = 1.0;
  this->m_static_color_float[3] = 0.78431374;
  return;
}

Assistant:

TextureViewTestCoherency::TextureViewTestCoherency(deqp::Context& context)
	: TestCase(context, "coherency", "Verifies view/parent texture coherency")
	, m_are_images_supported(false)
	, m_bo_id(0)
	, m_draw_fbo_id(0)
	, m_gradient_verification_po_id(0)
	, m_gradient_verification_po_sample_exact_uv_location(-1)
	, m_gradient_verification_po_lod_location(-1)
	, m_gradient_verification_po_texture_location(-1)
	, m_gradient_verification_vs_id(0)
	, m_gradient_image_write_image_size_location(-1)
	, m_gradient_image_write_po_id(0)
	, m_gradient_image_write_vs_id(0)
	, m_gradient_write_po_id(0)
	, m_gradient_write_fs_id(0)
	, m_gradient_write_vs_id(0)
	, m_read_fbo_id(0)
	, m_static_to_id(0)
	, m_to_id(0)
	, m_vao_id(0)
	, m_view_to_id(0)
	, m_verification_po_expected_color_location(-1)
	, m_verification_po_lod_location(-1)
	, m_verification_po_id(0)
	, m_verification_vs_id(0)
	, m_static_texture_height(1)
	, m_static_texture_width(1)
	, m_texture_height(64)
	, m_texture_n_components(4)
	, m_texture_n_levels(7)
	, m_texture_width(64)
{
	/* Initialize static color that will be used for some of the cases */
	m_static_color_byte[0] = 100;
	m_static_color_byte[1] = 0;
	m_static_color_byte[2] = 255;
	m_static_color_byte[3] = 200;

	m_static_color_float[0] = float(m_static_color_byte[0]) / 255.0f;
	m_static_color_float[1] = float(m_static_color_byte[1]) / 255.0f;
	m_static_color_float[2] = float(m_static_color_byte[2]) / 255.0f;
	m_static_color_float[3] = float(m_static_color_byte[3]) / 255.0f;
}